

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O0

void __thiscall CVmHashEntryDict::~CVmHashEntryDict(CVmHashEntryDict *this)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  vm_dict_entry *nxt;
  
  *in_RDI = &PTR__CVmHashEntryDict_003e2b48;
  while (in_RDI[5] != 0) {
    uVar1 = *(undefined8 *)(in_RDI[5] + 8);
    if ((void *)in_RDI[5] != (void *)0x0) {
      operator_delete((void *)in_RDI[5],0x18);
    }
    in_RDI[5] = uVar1;
  }
  CVmHashEntryCS::~CVmHashEntryCS((CVmHashEntryCS *)0x2d9687);
  return;
}

Assistant:

~CVmHashEntryDict()
    {
        /* delete all of our entries */
        while (list_ != 0)
        {
            vm_dict_entry *nxt;

            /* note the next entry */
            nxt = list_->nxt_;

            /* delete the current entry */
            delete list_;

            /* move on to the next entry */
            list_ = nxt;
        }
    }